

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::UpdateRotation(ChElementBeamTaperedTimoshenko *this)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char cVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar37;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  double dVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  double dVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 in_ZMM19 [64];
  undefined1 auVar116 [16];
  ChMatrix33<double> Aabs;
  ChMatrix33<double> A0;
  ulong local_158;
  ulong local_138;
  ulong local_128;
  double local_e8;
  double dStack_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  ChMatrix33<double> *local_68;
  double *local_60;
  ChMatrix33<double> local_58;
  undefined1 extraout_var [56];
  
  auVar21 = in_ZMM19._0_16_;
  ChMatrix33<double>::ChMatrix33(&local_58,&this->q_element_ref_rot);
  if (this->disable_corotate == true) {
    local_e8 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
    dStack_e0 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
    dStack_d8 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
    dStack_d0 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
    dStack_c8 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
    dStack_c0 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
    dStack_b8 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [6];
    dStack_b0 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
    local_a8 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
    (this->q_element_abs_rot).m_data[0] = (this->q_element_ref_rot).m_data[0];
    dVar37 = (this->q_element_ref_rot).m_data[2];
    (this->q_element_abs_rot).m_data[1] = (this->q_element_ref_rot).m_data[1];
    (this->q_element_abs_rot).m_data[2] = dVar37;
    dVar37 = (this->q_element_ref_rot).m_data[3];
    goto LAB_0067d99b;
  }
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)&peVar3->field_0x28;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)((long)&peVar2->super_ChNodeFEAbase + 0x20);
  auVar15 = vsubsd_avx512f(auVar15,auVar19);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)&peVar2->field_0x28;
  auVar16 = vsubsd_avx512f(auVar25,auVar22);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)&peVar3->field_0x30;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)&peVar2->field_0x30;
  auVar17 = vsubsd_avx512f(auVar18,auVar23);
  dVar37 = (this->q_refrotA).m_data[0];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar37;
  dVar37 = dVar37 * dVar37;
  dVar36 = (this->q_refrotA).m_data[1];
  dVar75 = (this->q_refrotA).m_data[2];
  dVar100 = (this->q_refrotA).m_data[3];
  auVar18 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar19 = vxorpd_avx512vl(auVar24,auVar18);
  dVar35 = auVar19._0_8_;
  auVar39 = ZEXT816(0xbff0000000000000);
  auVar49 = ZEXT816(0x4000000000000000);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar37 + dVar36 * dVar36;
  auVar19 = vfmadd213sd_fma(auVar26,auVar49,auVar39);
  dVar84 = dVar36 * dVar75 - dVar100 * dVar35;
  auVar20 = vxorpd_avx512vl(auVar21,auVar21);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar84 + dVar84;
  auVar21 = vfmadd231sd_avx512f(auVar76,auVar20,auVar19);
  dVar84 = dVar75 * dVar35 + dVar36 * dVar100;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar84 + dVar84;
  auVar22 = vfmadd213sd_avx512f(auVar27,auVar20,auVar21);
  dVar84 = dVar36 * dVar75 + dVar100 * dVar35;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar37 + dVar75 * dVar75;
  auVar21 = vfmadd213sd_fma(auVar63,auVar49,auVar39);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar84 + dVar84;
  auVar21 = vfmadd231sd_avx512f(auVar21,auVar20,auVar77);
  dVar84 = dVar75 * dVar100 - dVar36 * dVar35;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar84 + dVar84;
  auVar19 = vfmadd213sd_avx512f(auVar78,auVar20,auVar21);
  dVar84 = dVar36 * dVar100 - dVar75 * dVar35;
  dVar36 = dVar36 * dVar35 + dVar75 * dVar100;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar36 + dVar36;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar84 + dVar84;
  auVar23 = vfmadd231sd_avx512f(auVar54,auVar20,auVar64);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar37 + dVar100 * dVar100;
  auVar21 = vfmadd213sd_fma(auVar65,auVar49,auVar39);
  auVar24 = vfmadd213sd_avx512f(auVar21,auVar20,auVar23);
  dVar37 = *(double *)&peVar2->field_0x38;
  dVar36 = *(double *)&peVar2->field_0x40;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar36;
  dVar35 = dVar37 * dVar37;
  dVar75 = *(double *)&peVar2->field_0x48;
  dVar100 = *(double *)&peVar2->field_0x50;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar100;
  auVar23 = vmulsd_avx512f(auVar55,auVar108);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar36 * dVar36 + dVar35;
  auVar21 = vfmadd213sd_fma(auVar56,auVar49,auVar39);
  dVar84 = dVar75 * dVar36 - dVar100 * dVar37;
  dVar74 = auVar19._0_8_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = (dVar84 + dVar84) * dVar74;
  auVar21 = vfmadd231sd_fma(auVar92,auVar22,auVar21);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar75 * dVar37;
  auVar19 = vaddsd_avx512f(auVar113,auVar23);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar19._0_8_ + auVar19._0_8_;
  auVar21 = vfmadd213sd_fma(auVar57,auVar24,auVar21);
  dVar84 = dVar75 * dVar36 + dVar100 * dVar37;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar75 * dVar75 + dVar35;
  auVar19 = vfmadd213sd_fma(auVar93,auVar49,auVar39);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar84 + dVar84;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = auVar19._0_8_ * dVar74;
  auVar19 = vfmadd231sd_fma(auVar94,auVar22,auVar29);
  dVar84 = dVar75 * dVar100 - dVar37 * dVar36;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar84 + dVar84;
  auVar19 = vfmadd213sd_fma(auVar30,auVar24,auVar19);
  auVar23 = vsubsd_avx512f(auVar23,auVar113);
  dVar37 = dVar37 * dVar36 + dVar75 * dVar100;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = (dVar37 + dVar37) * dVar74;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = auVar23._0_8_ + auVar23._0_8_;
  auVar23 = vfmadd231sd_fma(auVar79,auVar22,auVar95);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar100 * dVar100 + dVar35;
  auVar22 = vfmadd213sd_fma(auVar28,auVar49,auVar39);
  auVar22 = vfmadd213sd_fma(auVar22,auVar24,auVar23);
  dVar37 = (this->q_refrotB).m_data[0];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar37;
  dVar37 = dVar37 * dVar37;
  dVar36 = (this->q_refrotB).m_data[1];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar36;
  dVar75 = (this->q_refrotB).m_data[2];
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar75;
  dVar100 = (this->q_refrotB).m_data[3];
  auVar23 = vxorpd_avx512vl(auVar66,auVar18);
  dVar35 = auVar23._0_8_;
  auVar24 = vmulsd_avx512f(auVar85,auVar101);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar36 * dVar36 + dVar37;
  auVar23 = vfmadd213sd_fma(auVar67,auVar49,auVar39);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar100 * dVar35;
  auVar25 = vsubsd_avx512f(auVar24,auVar115);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = auVar25._0_8_ + auVar25._0_8_;
  auVar23 = vfmadd231sd_avx512f(auVar96,auVar20,auVar23);
  dVar84 = dVar75 * dVar35 + dVar100 * dVar36;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar84 + dVar84;
  auVar25 = vfmadd213sd_avx512f(auVar68,auVar20,auVar23);
  auVar24 = vaddsd_avx512f(auVar24,auVar115);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar75 * dVar75 + dVar37;
  auVar23 = vfmadd213sd_fma(auVar104,auVar49,auVar39);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = auVar24._0_8_ + auVar24._0_8_;
  auVar23 = vfmadd231sd_avx512f(auVar23,auVar20,auVar97);
  dVar84 = dVar75 * dVar100 - dVar36 * dVar35;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar84 + dVar84;
  auVar24 = vfmadd213sd_avx512f(auVar98,auVar20,auVar23);
  dVar84 = dVar100 * dVar36 - dVar75 * dVar35;
  dVar36 = dVar36 * dVar35 + dVar75 * dVar100;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar84 + dVar84;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar36 + dVar36;
  auVar26 = vfmadd231sd_avx512f(auVar102,auVar20,auVar86);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar100 * dVar100 + dVar37;
  auVar23 = vfmadd213sd_fma(auVar80,auVar49,auVar39);
  auVar26 = vfmadd213sd_avx512f(auVar23,auVar20,auVar26);
  dVar37 = *(double *)&peVar3->field_0x38;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar37;
  dVar84 = dVar37 * dVar37;
  dVar36 = *(double *)&peVar3->field_0x40;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar36;
  dVar75 = *(double *)&peVar3->field_0x48;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar75;
  dVar100 = *(double *)&peVar3->field_0x50;
  auVar27 = vmulsd_avx512f(auVar87,auVar105);
  auVar28 = vmulsd_avx512f(auVar87,auVar111);
  auVar29 = vmulsd_avx512f(auVar105,auVar111);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar84 + dVar36 * dVar36;
  auVar23 = vfmadd213sd_fma(auVar109,auVar49,auVar39);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar100 * dVar37;
  auVar30 = vsubsd_avx512f(auVar29,auVar88);
  dVar35 = auVar24._0_8_;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar35 * (auVar30._0_8_ + auVar30._0_8_);
  auVar23 = vfmadd231sd_fma(auVar114,auVar25,auVar23);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar36 * dVar100;
  auVar24 = vaddsd_avx512f(auVar28,auVar106);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = auVar24._0_8_ + auVar24._0_8_;
  auVar23 = vfmadd213sd_fma(auVar110,auVar26,auVar23);
  dVar37 = auVar23._0_8_ + auVar21._0_8_;
  auVar23 = vaddsd_avx512f(auVar29,auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar84 + dVar75 * dVar75;
  auVar21 = vfmadd213sd_fma(auVar89,auVar49,auVar39);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = auVar23._0_8_ + auVar23._0_8_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar35 * auVar21._0_8_;
  auVar21 = vfmadd231sd_fma(auVar90,auVar25,auVar58);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar75 * dVar100;
  auVar23 = vsubsd_avx512f(auVar112,auVar27);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = auVar23._0_8_ + auVar23._0_8_;
  auVar21 = vfmadd213sd_fma(auVar59,auVar26,auVar21);
  dVar36 = auVar19._0_8_ + auVar21._0_8_;
  auVar21 = vsubsd_avx512f(auVar106,auVar28);
  auVar19 = vaddsd_avx512f(auVar27,auVar112);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar21._0_8_ + auVar21._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar35 * (auVar19._0_8_ + auVar19._0_8_);
  auVar19 = vfmadd231sd_fma(auVar60,auVar25,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar84 + dVar100 * dVar100;
  auVar21 = vfmadd213sd_fma(auVar52,auVar49,auVar39);
  auVar21 = vfmadd213sd_fma(auVar21,auVar26,auVar19);
  dVar75 = auVar22._0_8_ + auVar21._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar36 * dVar36;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar37;
  auVar21 = vfmadd231sd_fma(auVar21,auVar49,auVar49);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar75;
  vfmadd231sd_fma(auVar21,auVar39,auVar39);
  auVar21 = vucomisd_avx512f(auVar20);
  if (this->disable_corotate == false) {
    vmovsd_avx512f(auVar15);
    vmovsd_avx512f(auVar16);
    vmovsd_avx512f(auVar17);
    auVar48._0_8_ = sqrt(auVar21._0_8_);
    auVar48._8_56_ = extraout_var;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_158;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_138;
    auVar20 = vxorpd_avx512vl(auVar20,auVar20);
    auVar21 = auVar48._0_16_;
  }
  else {
    auVar21 = vsqrtsd_avx(auVar21,auVar21);
  }
  dVar100 = auVar21._0_8_;
  bVar4 = dVar100 != 2.2250738585072014e-308;
  bVar10 = 2.2250738585072014e-308 <= dVar100;
  auVar99 = ZEXT816(0x3ff0000000000000);
  local_98 = 1.0 / dVar100;
  local_78 = dVar37 * local_98;
  local_88 = local_98 * dVar36;
  local_98 = local_98 * dVar75;
  uStack_80 = 0;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (ulong)bVar10 * (long)local_88;
  uStack_70 = 0;
  auVar32._0_8_ = (double)((ulong)bVar10 * (long)local_78 + (ulong)!bVar10 * 0x3ff0000000000000);
  auVar32._8_8_ = 0;
  uStack_90 = 0;
  dVar37 = (double)((ulong)bVar10 * (long)local_98);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar37;
  auVar116 = vucomisd_avx512f(auVar20);
  if (bVar4) {
LAB_0067d3aa:
    auVar19 = vmulsd_avx512f(auVar16,auVar16);
    auVar19 = vfmadd231sd_avx512f(auVar19,auVar116,auVar116);
    auVar19 = vfmadd231sd_avx512f(auVar19,auVar17,auVar17);
    if (auVar19._0_8_ < 0.0) {
      vmovsd_avx512f(auVar116);
      vmovsd_avx512f(auVar16);
      vmovsd_avx512f(auVar17);
      dVar36 = sqrt(auVar19._0_8_);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_158;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_138;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = local_128;
    }
    else {
      auVar19 = vsqrtsd_avx(auVar19,auVar19);
      dVar36 = auVar19._0_8_;
    }
    bVar4 = 2.2250738585072014e-308 <= dVar36;
    auVar40._0_8_ = 1.0 / dVar36;
    auVar40._8_8_ = 0;
    auVar19 = vmulsd_avx512f(auVar116,auVar40);
    auVar22 = vmulsd_avx512f(auVar16,auVar40);
    auVar23 = vmulsd_avx512f(auVar17,auVar40);
    auVar91._8_8_ = auVar22._8_8_;
    auVar91._0_8_ = (ulong)bVar4 * auVar22._0_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = (ulong)bVar4 * auVar19._0_8_ + (ulong)!bVar4 * 0x3ff0000000000000;
    auVar20._8_8_ = auVar23._8_8_;
    auVar20._0_8_ = (ulong)bVar4 * auVar23._0_8_;
  }
  else {
    auVar16 = vucomisd_avx512f(ZEXT816(0));
    if (bVar4) goto LAB_0067d3aa;
    auVar17 = vucomisd_avx512f(ZEXT816(0));
    auVar91 = SUB6416(ZEXT864(0),0) << 0x40;
    if ((bVar4) || (NAN(dVar100))) goto LAB_0067d3aa;
  }
  auVar19 = vmulsd_avx512f(auVar31,auVar20);
  auVar19 = vfmsub231sd_fma(auVar19,auVar91,auVar33);
  dVar36 = auVar19._0_8_;
  dVar35 = auVar99._0_8_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar35 * dVar37;
  auVar23 = vfmsub231sd_avx512f(auVar81,auVar20,auVar32);
  dVar84 = auVar91._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = auVar32._0_8_ * dVar84;
  auVar22 = vfmsub231sd_fma(auVar61,auVar99,auVar31);
  dVar37 = auVar22._0_8_;
  dVar75 = auVar23._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar75 * dVar75;
  auVar19 = vfmadd231sd_fma(auVar41,auVar19,auVar19);
  auVar19 = vfmadd231sd_fma(auVar19,auVar22,auVar22);
  if (auVar19._0_8_ < 0.0) {
    local_a8 = sqrt(auVar19._0_8_);
  }
  else {
    auVar19 = vsqrtsd_avx(auVar19,auVar19);
    local_a8 = auVar19._0_8_;
  }
  if (local_a8 < 0.0001) {
    auVar19 = vxorpd_avx512vl(auVar20,auVar18);
    if ((dVar100 < 2.2250738585072014e-308) ||
       (auVar13._8_8_ = uStack_70, auVar13._0_8_ = local_78, auVar7._8_8_ = 0x7fffffffffffffff,
       auVar7._0_8_ = 0x7fffffffffffffff, auVar22 = vandpd_avx512vl(auVar13,auVar7),
       0.9 <= auVar22._0_8_)) {
      auVar22 = ZEXT816(0x3ff0000000000000);
      auVar34 = ZEXT816(0) << 0x40;
      if (dVar100 < 2.2250738585072014e-308) {
        auVar23 = ZEXT816(0) << 0x40;
      }
      else {
        auVar12._8_8_ = uStack_80;
        auVar12._0_8_ = local_88;
        auVar8._8_8_ = 0x7fffffffffffffff;
        auVar8._0_8_ = 0x7fffffffffffffff;
        auVar16 = vandpd_avx512vl(auVar12,auVar8);
        auVar23 = ZEXT816(0) << 0x40;
        if (0.9 <= auVar16._0_8_) {
          auVar11._8_8_ = uStack_90;
          auVar11._0_8_ = local_98;
          auVar9._8_8_ = 0x7fffffffffffffff;
          auVar9._0_8_ = 0x7fffffffffffffff;
          auVar22 = vandpd_avx512vl(auVar11,auVar9);
          uVar5 = vcmppd_avx512vl(auVar22,ZEXT816(0x3feccccccccccccd),5);
          uVar6 = vcmppd_avx512vl(auVar21,ZEXT816(0x10000000000000),5);
          auVar22 = ZEXT816(0);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = (ulong)!(bool)((byte)uVar6 & 3 & (byte)uVar5 & 3 & 1) * 0x3ff0000000000000
          ;
        }
      }
    }
    else {
      auVar23 = ZEXT816(0x3ff0000000000000);
      auVar34 = ZEXT816(0);
      auVar22 = SUB6416(ZEXT864(0),0) << 0x40;
    }
    auVar50._8_8_ = 0;
    auVar50._0_8_ = auVar22._0_8_ * auVar19._0_8_;
    auVar21 = vfmadd231sd_fma(auVar50,auVar91,auVar34);
    dVar36 = auVar21._0_8_;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = auVar34._0_8_ * (double)((ulong)dVar35 ^ auVar18._0_8_);
    auVar19 = vfmadd231sd_avx512f(auVar82,auVar20,auVar23);
    dVar75 = auVar19._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = auVar23._0_8_ * (double)((ulong)dVar84 ^ auVar18._0_8_);
    auVar19 = vfmadd231sd_fma(auVar62,auVar99,auVar22);
    dVar37 = auVar19._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar75 * dVar75;
    auVar21 = vfmadd231sd_fma(auVar42,auVar21,auVar21);
    auVar21 = vfmadd231sd_fma(auVar21,auVar19,auVar19);
    if (auVar21._0_8_ < 0.0) {
      local_a8 = sqrt(auVar21._0_8_);
    }
    else {
      auVar21 = vsqrtsd_avx(auVar21,auVar21);
      local_a8 = auVar21._0_8_;
    }
  }
  local_a8 = 1.0 / local_a8;
  dVar36 = dVar36 * local_a8;
  dVar75 = dVar75 * local_a8;
  local_a8 = dVar37 * local_a8;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar84 * local_a8;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar75;
  auVar21 = vfmsub231sd_avx512f(auVar83,auVar103,auVar20);
  dVar100 = auVar21._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar36;
  auVar21 = vmulsd_avx512f(auVar20,auVar70);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_a8;
  auVar21 = vfmsub231sd_fma(auVar21,auVar43,auVar99);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar35 * dVar75;
  auVar19 = vfmsub231sd_fma(auVar107,auVar70,auVar91);
  dVar74 = auVar19._0_8_;
  dStack_c8 = auVar21._0_8_;
  vmovsd_avx512f(auVar20);
  dVar37 = local_a8 + dVar35 + dStack_c8;
  local_e8 = dVar35;
  dStack_e0 = dVar100;
  dStack_d8 = dVar36;
  dStack_d0 = dVar84;
  dStack_c0 = dVar75;
  dStack_b0 = dVar74;
  if (0.0 <= dVar37) {
    dVar37 = dVar37 + 1.0;
    if (dVar37 < 0.0) {
      dVar37 = sqrt(dVar37);
    }
    else {
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar37;
      auVar21 = vsqrtsd_avx(auVar44,auVar44);
      dVar37 = auVar21._0_8_;
    }
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar36;
    dVar53 = dVar37 * 0.5;
    dVar37 = 0.5 / dVar37;
    dVar36 = (dVar74 - dVar75) * dVar37;
    auVar21 = vsubsd_avx512f(auVar71,auVar20);
    dVar35 = auVar21._0_8_ * dVar37;
    dVar37 = (dVar84 - dVar100) * dVar37;
  }
  else {
    cVar14 = dVar35 < dStack_c8;
    dVar37 = dVar35;
    if ((bool)cVar14) {
      dVar37 = dStack_c8;
    }
    if (dVar37 < local_a8) {
      cVar14 = '\x02';
    }
    if (cVar14 == '\x02') {
      dVar37 = ((local_a8 - dVar35) - dStack_c8) + 1.0;
      if (dVar37 < 0.0) {
        dVar38 = sqrt(dVar37);
      }
      else {
        auVar46._8_8_ = 0;
        auVar46._0_8_ = dVar37;
        auVar21 = vsqrtsd_avx(auVar46,auVar46);
        dVar38 = auVar21._0_8_;
      }
      auVar73._8_8_ = 0;
      auVar73._0_8_ = dVar36;
      dVar37 = dVar38 * 0.5;
      dVar38 = 0.5 / dVar38;
      auVar21 = vaddsd_avx512f(auVar20,auVar73);
      dVar36 = auVar21._0_8_ * dVar38;
      dVar35 = (dVar75 + dVar74) * dVar38;
      dVar53 = dVar84 - dVar100;
    }
    else if (cVar14 == '\x01') {
      dVar37 = ((dStack_c8 - local_a8) - dVar35) + 1.0;
      if (dVar37 < 0.0) {
        dVar38 = sqrt(dVar37);
      }
      else {
        auVar45._8_8_ = 0;
        auVar45._0_8_ = dVar37;
        auVar21 = vsqrtsd_avx(auVar45,auVar45);
        dVar38 = auVar21._0_8_;
      }
      auVar72._8_8_ = 0;
      auVar72._0_8_ = dVar36;
      dVar35 = dVar38 * 0.5;
      dVar38 = 0.5 / dVar38;
      dVar37 = (dVar75 + dVar74) * dVar38;
      dVar36 = (dVar84 + dVar100) * dVar38;
      auVar21 = vsubsd_avx512f(auVar72,auVar20);
      dVar53 = auVar21._0_8_;
    }
    else {
      dVar37 = ((dVar35 - dStack_c8) - local_a8) + 1.0;
      if (dVar37 < 0.0) {
        dVar38 = sqrt(dVar37);
      }
      else {
        auVar47._8_8_ = 0;
        auVar47._0_8_ = dVar37;
        auVar21 = vsqrtsd_avx(auVar47,auVar47);
        dVar38 = auVar21._0_8_;
      }
      auVar69._8_8_ = 0;
      auVar69._0_8_ = dVar36;
      dVar36 = dVar38 * 0.5;
      dVar38 = 0.5 / dVar38;
      dVar35 = (dVar84 + dVar100) * dVar38;
      auVar21 = vaddsd_avx512f(auVar20,auVar69);
      dVar37 = auVar21._0_8_ * dVar38;
      dVar53 = dVar74 - dVar75;
    }
    dVar53 = dVar53 * dVar38;
  }
  (this->q_element_abs_rot).m_data[0] = dVar53;
  (this->q_element_abs_rot).m_data[1] = dVar36;
  (this->q_element_abs_rot).m_data[2] = dVar35;
LAB_0067d99b:
  (this->q_element_abs_rot).m_data[3] = dVar37;
  local_60 = &local_e8;
  local_68 = &local_58;
  ChMatrix33<double>::operator=
            (&(this->super_ChElementCorotational).A,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_68);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::UpdateRotation() {
    ChMatrix33<> A0(this->q_element_ref_rot);

    ChMatrix33<> Aabs;
    if (this->disable_corotate) {
        Aabs = A0;
        q_element_abs_rot = q_element_ref_rot;
    } else {
        ChVector<> mXele_w = nodes[1]->Frame().GetPos() - nodes[0]->Frame().GetPos();
        // propose Y_w as absolute dir of the Y axis of A node, removing the effect of Aref-to-A rotation if any:
        //    Y_w = [R Aref->w ]*[R Aref->A ]'*{0,1,0}
        ChVector<> myele_wA = nodes[0]->Frame().GetRot().Rotate(q_refrotA.RotateBack(ChVector<>(0, 1, 0)));
        // propose Y_w as absolute dir of the Y axis of B node, removing the effect of Bref-to-B rotation if any:
        //    Y_w = [R Bref->w ]*[R Bref->B ]'*{0,1,0}
        ChVector<> myele_wB = nodes[1]->Frame().GetRot().Rotate(q_refrotB.RotateBack(ChVector<>(0, 1, 0)));
        // Average the two Y directions to have midpoint torsion (ex -30?torsion A and +30?torsion B= 0?
        ChVector<> myele_w = (myele_wA + myele_wB).GetNormalized();
        Aabs.Set_A_Xdir(mXele_w, myele_w);
        q_element_abs_rot = Aabs.Get_A_quaternion();
    }

    this->A = A0.transpose() * Aabs;
}